

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idct.c
# Opt level: O1

void av1_inv_txfm_add_c(tran_low_t *dqcoeff,uint8_t *dst,int stride,TxfmParam *txfm_param)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  int c;
  ulong uVar8;
  undefined1 *puVar9;
  uint16_t tmp [4096];
  undefined1 local_2060 [8240];
  
  puVar4 = local_2060;
  puVar9 = local_2060;
  uVar2 = tx_size_wide[txfm_param->tx_size];
  if (tx_size_wide[txfm_param->tx_size] < 2) {
    uVar2 = 1;
  }
  uVar1 = tx_size_high[txfm_param->tx_size];
  uVar3 = 1;
  if (1 < (int)uVar1) {
    uVar3 = uVar1;
  }
  uVar6 = 0;
  puVar7 = dst;
  do {
    uVar8 = 0;
    do {
      *(ushort *)(puVar4 + uVar8 * 2) = (ushort)puVar7[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
    uVar6 = uVar6 + 1;
    puVar7 = puVar7 + stride;
    puVar4 = puVar4 + 0x80;
  } while (uVar6 != uVar3);
  (*av1_highbd_inv_txfm_add)(dqcoeff,(uint8_t *)((ulong)local_2060 >> 1),0x40,txfm_param);
  uVar6 = 1;
  if (1 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  uVar8 = 0;
  do {
    uVar5 = 0;
    do {
      dst[uVar5] = puVar9[uVar5 * 2];
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
    uVar8 = uVar8 + 1;
    dst = dst + stride;
    puVar9 = puVar9 + 0x80;
  } while (uVar8 != uVar6);
  return;
}

Assistant:

void av1_inv_txfm_add_c(const tran_low_t *dqcoeff, uint8_t *dst, int stride,
                        const TxfmParam *txfm_param) {
  const TX_SIZE tx_size = txfm_param->tx_size;
  DECLARE_ALIGNED(32, uint16_t, tmp[MAX_TX_SQUARE]);
  int tmp_stride = MAX_TX_SIZE;
  int w = tx_size_wide[tx_size];
  int h = tx_size_high[tx_size];
  for (int r = 0; r < h; ++r) {
    for (int c = 0; c < w; ++c) {
      tmp[r * tmp_stride + c] = dst[r * stride + c];
    }
  }

  av1_highbd_inv_txfm_add(dqcoeff, CONVERT_TO_BYTEPTR(tmp), tmp_stride,
                          txfm_param);

  for (int r = 0; r < h; ++r) {
    for (int c = 0; c < w; ++c) {
      dst[r * stride + c] = (uint8_t)tmp[r * tmp_stride + c];
    }
  }
}